

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Event.h
# Opt level: O0

void __thiscall LogoutRequest::LogoutRequest(LogoutRequest *this,Event *e)

{
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  keysToBeInEvent;
  bool bVar1;
  EventNotValid *this_00;
  string *local_150;
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  local_e0 [2];
  undefined1 local_ba;
  allocator local_b9;
  string local_b8 [37];
  undefined1 local_93;
  allocator local_92;
  allocator local_91;
  string *local_90;
  string local_88 [32];
  string local_68 [32];
  iterator local_48;
  undefined8 local_40;
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  local_28;
  Event *local_18;
  Event *e_local;
  LogoutRequest *this_local;
  
  local_18 = e;
  e_local = (Event *)this;
  std::__cxx11::string::string((string *)this);
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  ::basic_json(&local_28,e);
  local_93 = 1;
  local_90 = local_88;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_88,"type",&local_91);
  local_90 = local_68;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_68,"username",&local_92);
  local_93 = 0;
  local_48 = (iterator)local_88;
  local_40 = 2;
  keysToBeInEvent._M_len = 2;
  keysToBeInEvent._M_array = local_48;
  bVar1 = checkEventKeys(&local_28,keysToBeInEvent);
  local_150 = (string *)&local_48;
  do {
    local_150 = local_150 + -0x20;
    std::__cxx11::string::~string(local_150);
  } while (local_150 != local_88);
  std::allocator<char>::~allocator((allocator<char> *)&local_92);
  std::allocator<char>::~allocator((allocator<char> *)&local_91);
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  ::~basic_json(&local_28);
  if (((bVar1 ^ 0xffU) & 1) == 0) {
    nlohmann::
    basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
    ::operator[]<char_const>
              ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                *)e,"username");
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
    ::
    get<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
              (local_e0);
    std::__cxx11::string::operator=((string *)this,(string *)local_e0);
    std::__cxx11::string::~string((string *)local_e0);
    return;
  }
  local_ba = 1;
  this_00 = (EventNotValid *)__cxa_allocate_exception(0x28);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_b8,"Improper LOGOUT_REQUEST",&local_b9);
  EventNotValid::EventNotValid(this_00,(string *)local_b8);
  local_ba = 0;
  __cxa_throw(this_00,&EventNotValid::typeinfo,EventNotValid::~EventNotValid);
}

Assistant:

explicit LogoutRequest(Event e){
      if(!checkEventKeys(e, {"type", "username"})) {
          throw EventNotValid("Improper LOGOUT_REQUEST");
      }
      try{
          username = e["username"].get<std::string>();
      }
      catch(...){
          throw EventNotValid("Improper LOGOUT_REQUEST");
      }
  }